

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

QLayoutItem * __thiscall
QFormLayoutPrivate::replaceAt(QFormLayoutPrivate *this,int index,QLayoutItem *newitem)

{
  int idx;
  QFormLayout *pQVar1;
  QFormLayoutItem **ppQVar2;
  QLayoutItem *in_RDX;
  uint in_ESI;
  QFormLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  QLayoutItem *olditem;
  QFormLayoutItem *item;
  int storageIndex;
  QFormLayout *q;
  int col;
  int row;
  ItemMatrix *in_stack_ffffffffffffff78;
  ItemMatrix *this_00;
  QMessageLogger *in_stack_ffffffffffffff90;
  QLayoutItem *local_38;
  int local_30 [2];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = q_func(in_RDI);
  if (in_RDX == (QLayoutItem *)0x0) {
    local_38 = (QLayoutItem *)0x0;
  }
  else {
    this_00 = &in_RDI->m_matrix;
    QList<QFormLayoutItem_*>::value(&this_00->m_storage,(qsizetype)in_stack_ffffffffffffff78);
    idx = storageIndexFromLayoutItem(in_stack_ffffffffffffff78,(QFormLayoutItem *)in_RDI);
    if (idx == -1) {
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff90,(char *)in_RDI,(int)((ulong)this_00 >> 0x20),
                 (char *)in_stack_ffffffffffffff78);
      QMessageLogger::warning
                (local_28,"QFormLayoutPrivate::replaceAt: Invalid index %d",(ulong)in_ESI);
      local_38 = (QLayoutItem *)0x0;
    }
    else {
      local_30[1] = 0xaaaaaaaa;
      local_30[0] = -0x55555556;
      QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::storageIndexToPosition
                (idx,local_30 + 1,local_30);
      ppQVar2 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                          (this_00,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                           (int)in_stack_ffffffffffffff78);
      local_38 = (*ppQVar2)->item;
      (*ppQVar2)->item = in_RDX;
      (**(code **)(*(long *)&pQVar1->super_QLayout + 0x70))();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_38;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem* QFormLayoutPrivate::replaceAt(int index, QLayoutItem *newitem)
{
    Q_Q(QFormLayout);
    if (!newitem)
        return nullptr;
    const int storageIndex = storageIndexFromLayoutItem(m_matrix, m_things.value(index));
    if (Q_UNLIKELY(storageIndex == -1)) {
        // ### Qt6 - fix warning too when this class becomes public
        qWarning("QFormLayoutPrivate::replaceAt: Invalid index %d", index);
        return nullptr;
    }

    int row, col;
    QFormLayoutPrivate::ItemMatrix::storageIndexToPosition(storageIndex, &row, &col);
    Q_ASSERT(m_matrix(row, col));

    QFormLayoutItem *item = m_matrix(row, col);
    Q_ASSERT(item);

    QLayoutItem *olditem = item->item;
    item->item = newitem;

    q->invalidate();
    return olditem;
}